

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_ref_t art_insert_at(art_t *art,art_ref_t ref,art_key_chunk_t *key,uint8_t depth,
                       art_ref_t new_leaf)

{
  _Bool _Var1;
  byte bVar2;
  art_key_chunk_t *key1;
  art_t *leaf_00;
  void *__dest;
  byte *pbVar3;
  art_ref_t aVar4;
  art_ref_t aVar5;
  art_node_t *paVar6;
  uint8_t in_CL;
  art_key_chunk_t *in_RDX;
  art_t *in_RSI;
  undefined8 in_R8;
  art_ref_t new_child;
  art_ref_t child;
  art_key_chunk_t key_chunk;
  art_node4_t *node4;
  art_key_chunk_t *prefix_copy;
  uint8_t common_prefix;
  art_inner_node_t *inner_node;
  art_ref_t new_ref;
  art_node_t *new_node;
  uint8_t common_prefix_1;
  art_leaf_t *leaf;
  art_ref_t in_stack_ffffffffffffff60;
  art_inner_node_t *in_stack_ffffffffffffff68;
  undefined2 uVar7;
  art_t *in_stack_ffffffffffffff70;
  art_t *art_00;
  art_t *in_stack_ffffffffffffff78;
  art_node4_t *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  art_ref_t in_stack_ffffffffffffffc8;
  uint8_t depth_00;
  undefined7 in_stack_ffffffffffffffd8;
  art_t *local_8;
  
  depth_00 = (uint8_t)((ulong)in_R8 >> 0x38);
  _Var1 = art_is_leaf(0x10dc6a);
  if (_Var1) {
    key1 = (art_key_chunk_t *)
           art_deref(in_stack_ffffffffffffff70,(art_ref_t)in_stack_ffffffffffffff68);
    art_common_prefix(key1,in_CL,'\x06',in_RDX,in_CL,'\x06');
    art_node4_create(in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->prefix_size,
                     (uint8_t)(in_stack_ffffffffffffff60 >> 0x38));
    uVar7 = (undefined2)((ulong)in_stack_ffffffffffffff68 >> 0x30);
    art_node_insert_leaf
              (in_stack_ffffffffffffff78,(art_inner_node_t *)in_stack_ffffffffffffff70,
               (art_typecode_t)((ulong)in_stack_ffffffffffffff68 >> 0x38),
               (art_key_chunk_t)((ulong)in_stack_ffffffffffffff68 >> 0x30),in_stack_ffffffffffffff60
              );
    local_8 = (art_t *)art_node_insert_leaf
                                 (in_stack_ffffffffffffff78,
                                  (art_inner_node_t *)in_stack_ffffffffffffff70,
                                  (art_typecode_t)((ushort)uVar7 >> 8),(art_key_chunk_t)uVar7,
                                  in_stack_ffffffffffffff60);
  }
  else {
    leaf_00 = (art_t *)art_deref(in_stack_ffffffffffffff70,(art_ref_t)in_stack_ffffffffffffff68);
    bVar2 = art_common_prefix((art_key_chunk_t *)((long)&leaf_00->root + 1),'\0',
                              (uint8_t)leaf_00->root,in_RDX,in_CL,'\x06');
    if (bVar2 == (byte)leaf_00->root) {
      art_00 = leaf_00;
      art_ref_typecode((art_ref_t)in_RSI);
      aVar4 = art_find_child(in_stack_ffffffffffffff68,
                             (art_typecode_t)(in_stack_ffffffffffffff60 >> 0x38),
                             (art_key_chunk_t)(in_stack_ffffffffffffff60 >> 0x30));
      if (aVar4 == 0) {
        art_ref_typecode((art_ref_t)in_RSI);
        local_8 = (art_t *)art_node_insert_leaf
                                     (in_stack_ffffffffffffff78,(art_inner_node_t *)art_00,
                                      (art_typecode_t)((ulong)in_stack_ffffffffffffff68 >> 0x38),
                                      (art_key_chunk_t)((ulong)in_stack_ffffffffffffff68 >> 0x30),
                                      (art_ref_t)leaf_00);
      }
      else {
        aVar5 = art_insert_at(in_RSI,(art_ref_t)in_RDX,
                              (art_key_chunk_t *)CONCAT17(in_CL,in_stack_ffffffffffffffd8),depth_00,
                              in_stack_ffffffffffffffc8);
        local_8 = in_RSI;
        if (aVar5 != aVar4) {
          paVar6 = art_deref(art_00,(art_ref_t)in_stack_ffffffffffffff68);
          uVar7 = (undefined2)((ulong)paVar6 >> 0x30);
          art_ref_typecode((art_ref_t)in_RSI);
          art_replace((art_inner_node_t *)art_00,(art_typecode_t)((ushort)uVar7 >> 8),
                      (art_key_chunk_t)uVar7,in_stack_ffffffffffffff60);
          local_8 = in_RSI;
        }
      }
    }
    else {
      __dest = roaring_malloc(0x10ddf3);
      memcpy(__dest,(void *)((long)&leaf_00->root + 1),(ulong)bVar2);
      art_node4_create(in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->prefix_size,
                       (uint8_t)(in_stack_ffffffffffffff60 >> 0x38));
      roaring_free((void *)0x10de3c);
      art_deref(in_stack_ffffffffffffff70,(art_ref_t)in_stack_ffffffffffffff68);
      art_node4_insert((art_t *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff80,(art_ref_t)in_stack_ffffffffffffff78,
                       (uint8_t)((ulong)in_stack_ffffffffffffff70 >> 0x38));
      pbVar3 = (byte *)art_deref(in_stack_ffffffffffffff70,(art_ref_t)in_stack_ffffffffffffff68);
      uVar7 = (undefined2)((ulong)in_stack_ffffffffffffff68 >> 0x30);
      *pbVar3 = (*pbVar3 - bVar2) - 1;
      if (*pbVar3 != 0) {
        memmove(pbVar3 + 1,pbVar3 + (long)(int)(uint)bVar2 + 2,(ulong)*pbVar3);
      }
      local_8 = (art_t *)art_node_insert_leaf
                                   (in_stack_ffffffffffffff78,
                                    (art_inner_node_t *)in_stack_ffffffffffffff70,
                                    (art_typecode_t)((ushort)uVar7 >> 8),(art_key_chunk_t)uVar7,
                                    in_stack_ffffffffffffff60);
    }
  }
  return (art_ref_t)local_8;
}

Assistant:

static art_ref_t art_insert_at(art_t *art, art_ref_t ref,
                               const art_key_chunk_t key[], uint8_t depth,
                               art_ref_t new_leaf) {
    if (art_is_leaf(ref)) {
        art_leaf_t *leaf = (art_leaf_t *)art_deref(art, ref);
        uint8_t common_prefix = art_common_prefix(
            leaf->key, depth, ART_KEY_BYTES, key, depth, ART_KEY_BYTES);

        // Previously this was a leaf, create an inner node instead and add
        // both the existing and new leaf to it.
        art_node_t *new_node =
            (art_node_t *)art_node4_create(art, key + depth, common_prefix);

        art_ref_t new_ref = art_node_insert_leaf(
            art, (art_inner_node_t *)new_node, CROARING_ART_NODE4_TYPE,
            leaf->key[depth + common_prefix], ref);
        new_ref = art_node_insert_leaf(art, (art_inner_node_t *)new_node,
                                       CROARING_ART_NODE4_TYPE,
                                       key[depth + common_prefix], new_leaf);

        // The new inner node is now the rootmost node.
        return new_ref;
    }
    art_inner_node_t *inner_node = (art_inner_node_t *)art_deref(art, ref);
    // Not a leaf: inner node
    uint8_t common_prefix =
        art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size, key,
                          depth, ART_KEY_BYTES);
    if (common_prefix != inner_node->prefix_size) {
        // Partial prefix match. Create a new internal node to hold the common
        // prefix.
        // We create a copy of the node's prefix as the creation of a new
        // node may invalidate the prefix pointer.
        art_key_chunk_t *prefix_copy = (art_key_chunk_t *)roaring_malloc(
            common_prefix * sizeof(art_key_chunk_t));
        memcpy(prefix_copy, inner_node->prefix,
               common_prefix * sizeof(art_key_chunk_t));
        art_node4_t *node4 = art_node4_create(art, prefix_copy, common_prefix);
        roaring_free(prefix_copy);

        // Deref as a new node was created.
        inner_node = (art_inner_node_t *)art_deref(art, ref);

        // Make the existing internal node a child of the new internal node.
        art_node4_insert(art, node4, ref, inner_node->prefix[common_prefix]);

        // Deref again as a new node was created.
        inner_node = (art_inner_node_t *)art_deref(art, ref);

        // Correct the prefix of the moved internal node, trimming off the
        // chunk inserted into the new internal node.
        inner_node->prefix_size = inner_node->prefix_size - common_prefix - 1;
        if (inner_node->prefix_size > 0) {
            // Move the remaining prefix to the correct position.
            memmove(inner_node->prefix, inner_node->prefix + common_prefix + 1,
                    inner_node->prefix_size);
        }

        // Insert the value in the new internal node.
        return art_node_insert_leaf(art, (art_inner_node_t *)node4,
                                    CROARING_ART_NODE4_TYPE,
                                    key[common_prefix + depth], new_leaf);
    }
    // Prefix matches entirely or node has no prefix. Look for an existing
    // child.
    art_key_chunk_t key_chunk = key[depth + common_prefix];
    art_ref_t child =
        art_find_child(inner_node, art_ref_typecode(ref), key_chunk);
    if (child != CROARING_ART_NULL_REF) {
        art_ref_t new_child =
            art_insert_at(art, child, key, depth + common_prefix + 1, new_leaf);
        if (new_child != child) {
            // Deref again as a new node may have been created.
            inner_node = (art_inner_node_t *)art_deref(art, ref);
            // Node type changed.
            art_replace(inner_node, art_ref_typecode(ref), key_chunk,
                        new_child);
        }
        return ref;
    }
    return art_node_insert_leaf(art, inner_node, art_ref_typecode(ref),
                                key_chunk, new_leaf);
}